

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void av1_rd_pick_inter_mode
               (AV1_COMP *cpi,TileDataEnc *tile_data,macroblock *x,RD_STATS *rd_cost,
               BLOCK_SIZE bsize,PICK_MODE_CONTEXT *ctx,int64_t best_rd_so_far)

{
  PREDICTION_MODE mode;
  char ref_frame_00;
  char cVar1;
  AV1_COMP *pAVar2;
  undefined8 uVar3;
  InterpFilter IVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int_mv iVar9;
  MB_MODE_INFO *pMVar10;
  RD_STATS *in_RCX;
  long lVar11;
  undefined8 *puVar12;
  AV1_COMP *in_RDX;
  long in_RSI;
  AV1_COMP *in_RDI;
  BLOCK_SIZE in_R8B;
  long in_R9;
  MB_MODE_INFO *in_stack_00000008;
  int_interpfilters filters;
  InterpFilter interp_filter;
  uchar segment_id;
  segmentation *seg;
  int this_skippable;
  RD_STATS this_rd_cost;
  int try_palette;
  int winner_mode_count;
  uint intra_ref_frame_cost;
  int64_t this_rd;
  int64_t this_yrd;
  int64_t skip_rd [2];
  int real_compmode_cost;
  int compmode_cost;
  int ref_frame_cost;
  RD_STATS rd_stats_uv;
  RD_STATS rd_stats_y;
  RD_STATS rd_stats;
  int64_t ref_best_rd;
  int is_skip_inter_mode;
  int comp_pred;
  int is_single_pred;
  MV_REFERENCE_FRAME second_ref_frame;
  MV_REFERENCE_FRAME ref_frame;
  MV_REFERENCE_FRAME *ref_frames;
  PREDICTION_MODE this_mode;
  MODE_DEFINITION *mode_def;
  THR_MODES mode_enum;
  THR_MODES midx;
  CurrentFrame *current_frame;
  THR_MODES mode_end;
  THR_MODES mode_start;
  int64_t best_inter_yrd;
  InterModeSFArgs sf_args;
  int mode_thresh_mul_fact;
  int max_winner_mode_count;
  int do_pruning;
  MV_REFERENCE_FRAME refs [2];
  MV_REFERENCE_FRAME frame;
  int valid_refs [7];
  PruneInfoFromTpl inter_cost_info_from_tpl;
  int mi_col;
  int mi_row;
  int64_t intra_cost;
  int64_t inter_cost;
  int64_t ref_frame_rd [8];
  uint8_t *tmp_buf;
  InterModesInfo *inter_modes_info;
  int do_tx_search;
  InterModeRdModel *md;
  int64_t best_est_rd;
  buf_2d yv12_mb [8] [3];
  uint ref_costs_comp [8] [8];
  uint ref_costs_single [8];
  mode_skip_mask_t mode_skip_mask;
  int skip_ref_frame_mask;
  int picked_ref_frames_mask;
  motion_mode_best_st_candidate best_motion_mode_cands;
  motion_mode_candidate motion_mode_cand;
  int max_winner_motion_mode_cand;
  int is_low_temp_var;
  HandleInterModeArgs args;
  INTERINTRA_MODE interintra_modes [8];
  InterModeSearchState search_state;
  int *comp_inter_cost;
  ModeCosts *mode_costs;
  int i;
  TxfmSearchInfo *txfm_info;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  SPEED_FEATURES *sf;
  int num_planes;
  FeatureFlags *features;
  AV1_COMMON *cm;
  int aiStackY_64c8 [756];
  undefined1 *puVar13;
  AV1_COMMON *cm_00;
  AV1_COMP *cpi_00;
  CANDIDATE_MV CVar14;
  WinnerModeStats *stats;
  CANDIDATE_MV CVar15;
  uint32_t uVar16;
  MACROBLOCKD *xd_00;
  uint *in_stack_ffffffffffffa720;
  MB_MODE_INFO *mbmi_00;
  RD_STATS *pRVar17;
  int skippable;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffa728;
  undefined4 uVar19;
  MACROBLOCK *pMVar18;
  int_mv *ctx_00;
  MACROBLOCK *in_stack_ffffffffffffa730;
  AV1_COMP *cpi_01;
  AV1_COMP *in_stack_ffffffffffffa738;
  AV1_COMP *in_stack_ffffffffffffa740;
  motion_mode_best_st_candidate *in_stack_ffffffffffffa748;
  AV1_COMMON *in_stack_ffffffffffffa750;
  undefined8 in_stack_ffffffffffffa758;
  THR_MODES inter_mode_end;
  MACROBLOCK *in_stack_ffffffffffffa760;
  THR_MODES in_stack_ffffffffffffa768;
  undefined2 in_stack_ffffffffffffa769;
  undefined1 in_stack_ffffffffffffa76b;
  bool bVar20;
  undefined4 in_stack_ffffffffffffa76c;
  THR_MODES intra_mode_end;
  AV1_COMMON *in_stack_ffffffffffffa770;
  AV1_COMP *in_stack_ffffffffffffa778;
  CANDIDATE_MV in_stack_ffffffffffffa780;
  MACROBLOCK *in_stack_ffffffffffffa788;
  undefined4 in_stack_ffffffffffffa790;
  uint32_t in_stack_ffffffffffffa794;
  uint32_t in_stack_ffffffffffffa798;
  int in_stack_ffffffffffffa79c;
  THR_MODES in_stack_ffffffffffffa7a0;
  undefined1 in_stack_ffffffffffffa7a1;
  undefined1 in_stack_ffffffffffffa7a2;
  undefined4 in_stack_ffffffffffffa7a3;
  int iVar21;
  undefined1 in_stack_ffffffffffffa7a7;
  BLOCK_SIZE BVar22;
  undefined1 in_stack_ffffffffffffa7a8;
  byte in_stack_ffffffffffffa7a9;
  undefined1 in_stack_ffffffffffffa7aa;
  undefined1 uVar23;
  AV1_COMMON *cm_01;
  int in_stack_ffffffffffffa7b8;
  undefined2 in_stack_ffffffffffffa7bc;
  undefined1 in_stack_ffffffffffffa7be;
  BLOCK_SIZE in_stack_ffffffffffffa7bf;
  AV1_COMP *in_stack_ffffffffffffa7c0;
  int in_stack_ffffffffffffa7c8;
  undefined4 in_stack_ffffffffffffa7cc;
  int local_5830;
  BLOCK_SIZE in_stack_ffffffffffffa7d7;
  HandleInterModeArgs *in_stack_ffffffffffffa7d8;
  MACROBLOCK *in_stack_ffffffffffffa7e0;
  undefined7 in_stack_ffffffffffffa7e8;
  BLOCK_SIZE in_stack_ffffffffffffa7ef;
  MACROBLOCK *in_stack_ffffffffffffa7f0;
  undefined4 in_stack_ffffffffffffa7f8;
  undefined4 in_stack_ffffffffffffa800;
  undefined4 in_stack_ffffffffffffa804;
  undefined4 uVar24;
  RD_STATS *in_stack_ffffffffffffa808;
  buf_2d (*in_stack_ffffffffffffa810) [3];
  AV1_PRIMARY *pAVar25;
  int_mv local_57e8;
  int_mv iStack_57e4;
  CANDIDATE_MV local_57e0;
  uint32_t local_57cc;
  uint32_t local_57c8;
  int local_57c4;
  undefined1 local_57c0 [32];
  int16_t *in_stack_ffffffffffffa860;
  int in_stack_ffffffffffffa868;
  uint32_t in_stack_ffffffffffffa86c;
  BLOCK_SIZE in_stack_ffffffffffffa877;
  PICK_MODE_CONTEXT *in_stack_ffffffffffffa878;
  MACROBLOCK *in_stack_ffffffffffffa880;
  AV1_COMP *in_stack_ffffffffffffa888;
  RD_STATS *in_stack_ffffffffffffa890;
  MACROBLOCK *in_stack_ffffffffffffa898;
  AV1_COMP *in_stack_ffffffffffffa8a0;
  MB_MODE_INFO *in_stack_ffffffffffffa8b0;
  CANDIDATE_MV in_stack_ffffffffffffa8b8;
  uint32_t in_stack_ffffffffffffa8c0;
  uint in_stack_ffffffffffffa8c8;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffa8d0;
  uint32_t in_stack_ffffffffffffa8d8;
  MODE_DEFINITION *in_stack_ffffffffffffa8e0;
  undefined6 in_stack_ffffffffffffa8e8;
  byte in_stack_ffffffffffffa8ee;
  AV1_COMMON *pAVar26;
  BLOCK_SIZE in_stack_ffffffffffffa8f8;
  byte local_5702;
  byte local_5701;
  AV1_PRIMARY *best_est_rd_00;
  InterModeSearchState *search_state_00;
  int64_t *yrd;
  char local_56b9;
  uint local_56b8 [6];
  buf_2d (*in_stack_ffffffffffffa960) [3];
  BLOCK_SIZE in_stack_ffffffffffffa96f;
  int16_t *in_stack_ffffffffffffa970;
  MACROBLOCK *in_stack_ffffffffffffa978;
  TileDataEnc *in_stack_ffffffffffffa980;
  AV1_COMP *in_stack_ffffffffffffa988;
  RefCntBuffer *pRVar27;
  RefCntBuffer *search_state_01;
  RefCntBuffer *in_stack_ffffffffffffa9c8;
  RefCntBuffer *in_stack_ffffffffffffa9d0;
  RefCntBuffer *in_stack_ffffffffffffa9d8;
  undefined1 local_55d0 [1704];
  PICK_MODE_CONTEXT *in_stack_ffffffffffffb0d8;
  uint in_stack_ffffffffffffb0e0;
  BLOCK_SIZE in_stack_ffffffffffffb0e7;
  MACROBLOCK *in_stack_ffffffffffffb0e8;
  AV1_COMP *in_stack_ffffffffffffb0f0;
  IntraModeSearchState *in_stack_ffffffffffffb0f8;
  RD_STATS *in_stack_ffffffffffffb140;
  qm_val_t *in_stack_ffffffffffffb148;
  PICK_MODE_CONTEXT *in_stack_ffffffffffffb178;
  BLOCK_SIZE in_stack_ffffffffffffb187;
  RD_STATS *in_stack_ffffffffffffb188;
  MACROBLOCK *in_stack_ffffffffffffb190;
  AV1_COMP *in_stack_ffffffffffffb198;
  InterModeSearchState *in_stack_ffffffffffffb1a0;
  InterModeSFArgs *in_stack_ffffffffffffb1d0;
  uint in_stack_ffffffffffffb1d8;
  qm_val_t *in_stack_ffffffffffffb1e0;
  RD_STATS *in_stack_ffffffffffffb3c0;
  RD_STATS *in_stack_ffffffffffffb3c8;
  BLOCK_SIZE in_stack_ffffffffffffb3d7;
  MACROBLOCK *in_stack_ffffffffffffb3d8;
  TileDataEnc *in_stack_ffffffffffffb3e0;
  AV1_COMP *in_stack_ffffffffffffb3e8;
  RD_STATS *in_stack_ffffffffffffb430;
  HandleInterModeArgs *in_stack_ffffffffffffb438;
  qm_val_t *in_stack_ffffffffffffb440;
  uint8_t *in_stack_ffffffffffffb448;
  CompoundTypeRdBuffers *in_stack_ffffffffffffb450;
  int64_t *in_stack_ffffffffffffb458;
  int in_stack_ffffffffffffb460;
  InterModesInfo *in_stack_ffffffffffffb468;
  motion_mode_candidate *in_stack_ffffffffffffb470;
  int64_t *in_stack_ffffffffffffb478;
  PruneInfoFromTpl *in_stack_ffffffffffffb480;
  int64_t *in_stack_ffffffffffffb488;
  uint local_4898;
  int local_4894;
  undefined1 local_4890 [88];
  qm_val_t *local_4838;
  qm_val_t *local_4830;
  qm_val_t *local_4828;
  int local_4820;
  uint32_t local_481c;
  qm_val_t *local_4818;
  undefined1 local_4810 [5168];
  int_mv local_33e0;
  int_mv local_33dc;
  undefined4 auStack_33d8 [37];
  int_mv local_3344;
  CANDIDATE_MV local_3340;
  undefined1 local_3338 [16];
  CANDIDATE_MV local_3328;
  undefined1 auStack_3320 [167];
  ushort local_3279;
  int_mv local_3270;
  int_mv local_3268;
  int_mv local_3264;
  int_mv local_3260 [366];
  int_mv local_2ca8;
  qm_val_t aqStack_2c88 [96];
  qm_val_t aqStack_2c28 [96];
  qm_val_t aqStack_2bc8 [96];
  qm_val_t aqStack_2b68 [4800];
  qm_val_t aqStack_18a8 [6136];
  uint32_t *local_b0;
  int16_t (*local_a8) [8];
  int local_9c;
  int *local_98;
  BLOCK_SIZE *local_90;
  MACROBLOCKD *local_88;
  SPEED_FEATURES *local_80;
  int local_74;
  FeatureFlags *local_70;
  AV1_COMMON *local_68;
  long local_60;
  BLOCK_SIZE local_51;
  RD_STATS *local_50;
  AV1_COMP *local_48;
  long local_40;
  AV1_COMP *local_38;
  
  BVar22 = (BLOCK_SIZE)((ulong)in_stack_ffffffffffffa758 >> 0x38);
  local_68 = &in_RDI->common;
  local_70 = &(in_RDI->common).features;
  local_60 = in_R9;
  local_51 = in_R8B;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  local_74 = av1_num_planes(local_68);
  local_80 = &local_38->sf;
  local_88 = (MACROBLOCKD *)((local_48->enc_quant_dequant_params).quants.y_quant + 0x19);
  local_90 = (BLOCK_SIZE *)
             **(undefined8 **)((local_48->enc_quant_dequant_params).quants.y_zbin[4] + 4);
  local_98 = (int *)((long)((local_48->td).mb.coeff_costs.coeff_costs[2][0].lps_cost + 6) + 0x58);
  local_a8 = (local_48->enc_quant_dequant_params).quants.y_quant_fp + 0x22;
  cm_01 = (AV1_COMMON *)((local_48->enc_quant_dequant_params).quants.y_round_fp + 0xff);
  iVar5 = av1_get_reference_mode_context((MACROBLOCKD *)in_stack_ffffffffffffa750);
  local_b0 = cm_01->buffer_removal_times + (long)iVar5 * 2 + -0x15;
  init_inter_mode_search_state
            ((InterModeSearchState *)in_stack_ffffffffffffa770,
             (AV1_COMP *)
             CONCAT44(in_stack_ffffffffffffa76c,
                      CONCAT13(in_stack_ffffffffffffa76b,
                               CONCAT21(in_stack_ffffffffffffa769,in_stack_ffffffffffffa768))),
             in_stack_ffffffffffffa760,BVar22,(int64_t)in_stack_ffffffffffffa750);
  local_3340.this_mv = (int_mv)0x4040404;
  local_3340.comp_mv = (int_mv)0x4040404;
  memset(local_4890,0,0x1550);
  local_4890._24_4_ = 0x80;
  local_4890._28_4_ = 0x80;
  local_4890._32_4_ = 0x80;
  local_4890._64_2_ = 0x40;
  local_4890._66_2_ = 0;
  local_4890._68_2_ = 0x40;
  local_4890._70_2_ = 0;
  local_4890[0x48] = '@';
  local_4890[0x49] = '\0';
  local_4890[0x4a] = '\0';
  local_4890[0x4b] = '\0';
  local_4828 = aqStack_2b68;
  local_4820 = 0x7fffffff;
  local_481c = 0x7fffffff;
  local_4818 = aqStack_18a8;
  local_4810._8_8_ = &local_3340;
  memcpy(local_4810 + 0x10,&DAT_00bb8fe8,0x1400);
  local_4810._5164_4_ = 0xffffffff;
  local_33e0.as_int = 0xffffffff;
  local_33dc.as_int = 0xffffffff;
  local_3344.as_int = 0xffffffff;
  local_4894 = get_block_temp_var(in_stack_ffffffffffffa738,in_stack_ffffffffffffa730,
                                  (BLOCK_SIZE)((ulong)in_stack_ffffffffffffa728 >> 0x38));
  for (local_9c = 0; local_9c < 0x1d; local_9c = local_9c + 1) {
    auStack_33d8[local_9c] = 0xffffffff;
  }
  local_4898 = num_winner_motion_modes[(local_80->winner_mode_sf).motion_mode_for_winner_cand];
  for (local_9c = 0; local_9c < 10; local_9c = local_9c + 1) {
    *(undefined8 *)(local_55d0 + (long)local_9c * 200 + 0x558) = 0x7fffffffffffffff;
  }
  for (local_9c = 0; local_9c < 8; local_9c = local_9c + 1) {
    *(undefined4 *)
     ((long)((local_48->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0x10) + (long)local_9c * 4)
         = 0x7fffffff;
  }
  av1_invalid_rd_stats(local_50);
  for (local_9c = 0; local_9c < 8; local_9c = local_9c + 1) {
    *(undefined4 *)
     ((long)(local_48->td).mb.e_mbd.plane[1].seg_iqmatrix[1] + (long)local_9c * 0x84 + 0x88U) =
         0xffffffff;
  }
  local_55d0._1172_4_ = 0;
  if ((((local_80->inter_sf).prune_ref_frame_for_rect_partitions != 0) && (local_90[1] != BLOCK_4X4)
      ) && (((local_90[1] != BLOCK_8X4 && (local_90[1] != BLOCK_4X8)) ||
            (1 < (local_80->inter_sf).prune_ref_frame_for_rect_partitions)))) {
    local_55d0._1172_4_ =
         fetch_picked_ref_frames_mask
                   ((MACROBLOCK *)local_48,local_51,local_68->seq_params->mib_size);
  }
  if (local_55d0._1172_4_ == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = local_55d0._1172_4_ ^ 0xffffffff;
  }
  puVar13 = local_55d0 + 0x408;
  stats = (WinnerModeStats *)(local_55d0 + 8);
  local_55d0._1168_4_ = uVar6;
  set_params_rd_pick_inter_mode
            ((AV1_COMP *)CONCAT17(in_stack_ffffffffffffa7ef,in_stack_ffffffffffffa7e8),
             in_stack_ffffffffffffa7e0,in_stack_ffffffffffffa7d8,in_stack_ffffffffffffa7d7,
             (mode_skip_mask_t *)CONCAT44(in_stack_ffffffffffffa7cc,in_stack_ffffffffffffa7c8),
             (int)((ulong)in_stack_ffffffffffffa7c0 >> 0x20),
             (uint *)CONCAT44(in_stack_ffffffffffffa804,in_stack_ffffffffffffa800),
             (uint (*) [8])in_stack_ffffffffffffa808,in_stack_ffffffffffffa810);
  local_55d0._0_8_ = (AV1_PRIMARY *)0x7fffffffffffffff;
  if ((((local_80->inter_sf).inter_mode_rd_model_estimation != 1) ||
      (uVar23 = true, *(int *)(local_40 + 0x5338 + (ulong)local_51 * 0x70) == 0)) &&
     (in_stack_ffffffffffffa7aa = false, uVar23 = in_stack_ffffffffffffa7aa,
     (local_80->inter_sf).inter_mode_rd_model_estimation == 2)) {
    in_stack_ffffffffffffa7aa =
         8 < "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[local_51];
    uVar23 = in_stack_ffffffffffffa7aa;
  }
  iVar9._0_1_ = (uVar23 ^ 0xff) & 1;
  iVar9.as_int._1_3_ = 0;
  pAVar2 = *(AV1_COMP **)((local_48->td).mb.mode_costs.palette_y_color_cost[1][0] + 6);
  *(int *)&pAVar2->ppi = 0;
  pMVar10 = (MB_MODE_INFO *)
            get_buf_by_bd(local_88,*(uint8_t **)
                                    ((local_48->enc_quant_dequant_params).quants.y_quant_fp[0x1e] +
                                    4));
  memcpy(&stack0xffffffffffffa9c8,&DAT_00bba420,0x40);
  uVar24 = (undefined4)((ulong)puVar13 >> 0x20);
  search_state_01 = (RefCntBuffer *)0xffffffffffffffff;
  pRVar27 = (RefCntBuffer *)0xffffffffffffffff;
  iVar5 = local_88->mi_col;
  if ((local_80->inter_sf).prune_inter_modes_based_on_tpl != 0) {
    for (local_56b9 = '\x01'; uVar24 = (undefined4)((ulong)puVar13 >> 0x20), local_56b9 < '\b';
        local_56b9 = local_56b9 + '\x01') {
      in_stack_ffffffffffffa7a9 = 1;
      if (*(char *)((long)(local_48->td).mb.e_mbd.plane[1].seg_iqmatrix[1] +
                   (long)local_56b9 + 0x80U) == '\0') {
        iVar7 = prune_ref_by_selective_ref_frame
                          (in_stack_ffffffffffffa738,in_stack_ffffffffffffa730,
                           in_stack_ffffffffffffa728,in_stack_ffffffffffffa720);
        in_stack_ffffffffffffa7a9 = iVar7 != 0 ^ 0xff;
      }
      local_56b8[local_56b9 + -1] = (uint)(in_stack_ffffffffffffa7a9 & 1);
    }
    memset(&stack0xffffffffffffa970,0,0x40);
    get_block_level_tpl_stats
              (in_stack_ffffffffffffa7c0,in_stack_ffffffffffffa7bf,in_stack_ffffffffffffa7b8,
               (int)((ulong)cm_01 >> 0x20),
               (int *)CONCAT44(uVar6,CONCAT13(uVar23,CONCAT12(in_stack_ffffffffffffa7aa,
                                                              CONCAT11(in_stack_ffffffffffffa7a9,
                                                                       in_stack_ffffffffffffa7a8))))
               ,(PruneInfoFromTpl *)
                CONCAT17(in_stack_ffffffffffffa7a7,
                         CONCAT43(in_stack_ffffffffffffa7a3,
                                  CONCAT12(in_stack_ffffffffffffa7a2,
                                           CONCAT11(in_stack_ffffffffffffa7a1,
                                                    in_stack_ffffffffffffa7a0)))));
  }
  uVar8 = (uint)((ulong)in_stack_ffffffffffffa730 >> 0x20);
  uVar19 = (undefined4)((ulong)in_stack_ffffffffffffa728 >> 0x20);
  if (local_68->width < local_68->height) {
    iVar7 = local_68->width;
    BVar22 = (BLOCK_SIZE)((uint)iVar7 >> 0x18);
  }
  else {
    iVar7 = local_68->height;
    BVar22 = (BLOCK_SIZE)((uint)iVar7 >> 0x18);
  }
  iVar21 = iVar7 << 8;
  if (0x1e0 < CONCAT13(BVar22,(int3)iVar7)) {
    iVar21 = CONCAT31((int3)iVar7,local_38->speed < 2);
  }
  if ((((char)iVar21 == '\0') && ((local_80->intra_sf).skip_intra_in_interframe != 0)) &&
     (((local_38->oxcf).algo_cfg.enable_tpl_model & 1U) != 0)) {
    uVar24 = (undefined4)((ulong)&stack0xffffffffffffa9b8 >> 0x20);
    calculate_cost_from_tpl_data
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffa794,in_stack_ffffffffffffa790),
               in_stack_ffffffffffffa788,in_stack_ffffffffffffa780.comp_mv._3_1_,
               in_stack_ffffffffffffa780.this_mv.as_int,
               (int)((ulong)in_stack_ffffffffffffa778 >> 0x20),(int64_t *)in_stack_ffffffffffffa770,
               (int64_t *)
               CONCAT17(BVar22,CONCAT43(iVar21,CONCAT12(in_stack_ffffffffffffa7a2,
                                                        CONCAT11(in_stack_ffffffffffffa7a1,
                                                                 in_stack_ffffffffffffa7a0)))));
  }
  zero_winner_mode_stats
            ((BLOCK_SIZE)((ulong)in_stack_ffffffffffffa720 >> 0x38),(int)in_stack_ffffffffffffa720,
             stats);
  (local_48->td).mb.mode_costs.palette_y_color_cost[1][0][4] = 0;
  cm_00 = (AV1_COMMON *)CONCAT44(uVar24,0xff);
  cpi_00 = (AV1_COMP *)0x0;
  CVar15 = (CANDIDATE_MV)((ulong)stats & 0xffffffff00000000);
  pMVar18 = (MACROBLOCK *)CONCAT44(uVar19,(uint)(local_80->winner_mode_sf).multi_winner_mode_type);
  cpi_01 = (AV1_COMP *)((ulong)uVar8 << 0x20);
  mbmi_00 = in_stack_00000008;
  store_winner_mode_stats
            ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffa794,in_stack_ffffffffffffa790),
             in_stack_ffffffffffffa788,(MB_MODE_INFO *)in_stack_ffffffffffffa780,
             (RD_STATS *)in_stack_ffffffffffffa778,(RD_STATS *)in_stack_ffffffffffffa770,
             (RD_STATS *)
             CONCAT44(in_stack_ffffffffffffa76c,
                      CONCAT13(in_stack_ffffffffffffa76b,
                               CONCAT21(in_stack_ffffffffffffa769,in_stack_ffffffffffffa768))),
             in_stack_ffffffffffffa7a0,
             (uint8_t *)
             CONCAT44(uVar6,CONCAT13(uVar23,CONCAT12(in_stack_ffffffffffffa7aa,
                                                     CONCAT11(in_stack_ffffffffffffa7a9,
                                                              in_stack_ffffffffffffa7a8)))),
             (BLOCK_SIZE)cm_01,
             CONCAT17(in_stack_ffffffffffffa7bf,
                      CONCAT16(in_stack_ffffffffffffa7be,
                               CONCAT24(in_stack_ffffffffffffa7bc,in_stack_ffffffffffffa7b8))),
             (int)in_stack_ffffffffffffa7c0,in_stack_ffffffffffffa7c8);
  search_state_00 = (InterModeSearchState *)local_4810;
  yrd = (int64_t *)(local_55d0 + 0x428);
  best_est_rd_00 = (AV1_PRIMARY *)0x7fffffffffffffff;
  local_5702 = 0x9c;
  if ((local_68->current_frame).reference_mode == '\0') {
    local_5702 = 0x1c;
  }
  local_5701 = 0;
  pAVar26 = local_68;
  while( true ) {
    inter_mode_end = (THR_MODES)in_stack_ffffffffffffa760;
    iVar7 = (int)pRVar27;
    if (local_5702 <= local_5701) break;
    in_stack_ffffffffffffa8ee = ""[local_5701];
    in_stack_ffffffffffffa8e0 = av1_mode_defs + in_stack_ffffffffffffa8ee;
    mode = in_stack_ffffffffffffa8e0->mode;
    in_stack_ffffffffffffa8d0 = av1_mode_defs[in_stack_ffffffffffffa8ee].ref_frame;
    ref_frame_00 = *in_stack_ffffffffffffa8d0;
    cVar1 = av1_mode_defs[in_stack_ffffffffffffa8ee].ref_frame[1];
    in_stack_ffffffffffffa7a2 = '\0' < ref_frame_00 && cVar1 == -1;
    in_stack_ffffffffffffa8c8 = (uint)(byte)in_stack_ffffffffffffa7a2;
    uVar8 = (uint)('\0' < cVar1);
    init_mbmi(mbmi_00,CVar15.comp_mv._3_1_,(MV_REFERENCE_FRAME *)cpi_00,cm_00);
    uVar24 = (undefined4)((ulong)cm_00 >> 0x20);
    *(byte *)local_98 = 0;
    set_ref_ptrs((AV1_COMMON *)cpi_01,(MACROBLOCKD *)pMVar18,
                 (MV_REFERENCE_FRAME)((ulong)mbmi_00 >> 0x38),
                 (MV_REFERENCE_FRAME)((ulong)mbmi_00 >> 0x30));
    cm_00 = (AV1_COMMON *)CONCAT44(uVar24,local_4894);
    in_stack_ffffffffffffa8c0 =
         skip_inter_mode((AV1_COMP *)CONCAT44(in_stack_ffffffffffffa79c,in_stack_ffffffffffffa798),
                         (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffa794,in_stack_ffffffffffffa790)
                         ,(BLOCK_SIZE)((ulong)in_stack_ffffffffffffa788 >> 0x38),
                         (int64_t *)in_stack_ffffffffffffa780,
                         (int)((ulong)in_stack_ffffffffffffa778 >> 0x20),
                         (InterModeSFArgs *)in_stack_ffffffffffffa770,(int)cm_01);
    if (in_stack_ffffffffffffa8c0 == 0) {
      for (local_9c = 0; local_9c < local_74; local_9c = local_9c + 1) {
        lVar11 = (long)local_9c;
        puVar12 = (undefined8 *)(local_55d0 + (long)local_9c * 0x20 + (long)ref_frame_00 * 0x60 + 8)
        ;
        local_88->plane[lVar11].pre[0].buf = (uint8_t *)*puVar12;
        local_88->plane[lVar11].pre[0].buf0 = (uint8_t *)puVar12[1];
        uVar3 = puVar12[2];
        local_88->plane[lVar11].pre[0].width = (int)uVar3;
        local_88->plane[lVar11].pre[0].height = (int)((ulong)uVar3 >> 0x20);
        *(undefined8 *)&local_88->plane[lVar11].pre[0].stride = puVar12[3];
        if (uVar8 != 0) {
          lVar11 = (long)local_9c;
          puVar12 = (undefined8 *)(local_55d0 + (long)local_9c * 0x20 + (long)cVar1 * 0x60 + 8);
          local_88->plane[lVar11].pre[1].buf = (uint8_t *)*puVar12;
          local_88->plane[lVar11].pre[1].buf0 = (uint8_t *)puVar12[1];
          uVar3 = puVar12[2];
          local_88->plane[lVar11].pre[1].width = (int)uVar3;
          local_88->plane[lVar11].pre[1].height = (int)((ulong)uVar3 >> 0x20);
          *(undefined8 *)&local_88->plane[lVar11].pre[1].stride = puVar12[3];
        }
      }
      local_90[0x58] = BLOCK_4X4;
      local_90[0x59] = BLOCK_4X4;
      local_90[0x5b] = BLOCK_4X4;
      *(undefined2 *)(local_90 + 0xa7) = *(undefined2 *)(local_90 + 0xa7) & 0xffcf;
      in_stack_ffffffffffffa8b8 = (CANDIDATE_MV)local_3338._0_8_;
      av1_init_rd_stats((RD_STATS *)&stack0xffffffffffffa890);
      if (uVar8 == 0) {
        in_stack_ffffffffffffa79c = *(int *)(local_55d0 + (long)ref_frame_00 * 4 + 0x408);
      }
      else {
        in_stack_ffffffffffffa79c =
             *(int *)(local_55d0 + (long)cVar1 * 4 + (long)ref_frame_00 * 0x20 + 0x308);
      }
      local_57c4 = in_stack_ffffffffffffa79c;
      iVar7 = is_comp_ref_allowed(*local_90);
      if (iVar7 == 0) {
        in_stack_ffffffffffffa798 = 0;
      }
      else {
        in_stack_ffffffffffffa798 = local_b0[(int)uVar8];
      }
      in_stack_ffffffffffffa794 = in_stack_ffffffffffffa798;
      if ((local_68->current_frame).reference_mode != '\x02') {
        in_stack_ffffffffffffa794 = 0;
      }
      local_4890._80_8_ = aqStack_2c88;
      local_4838 = aqStack_2c28;
      local_4830 = aqStack_2bc8;
      local_4820 = local_57c4;
      local_3344 = local_2ca8;
      local_57cc = in_stack_ffffffffffffa794;
      local_57c8 = in_stack_ffffffffffffa798;
      local_481c = in_stack_ffffffffffffa794;
      local_4810[4] = skip_interp_filter_search(local_38,in_stack_ffffffffffffa8c8);
      iVar7 = frame_is_kf_gf_arf(cpi_00);
      if (((iVar7 != 0) || ((local_38->oxcf).algo_cfg.sharpness != 3)) ||
         ((ref_frame_00 == '\a' || ((ref_frame_00 == '\x04' || (ref_frame_00 == '\0')))))) {
        local_57e8 = (int_mv)local_3338._8_4_;
        iStack_57e4 = (int_mv)local_3338._12_4_;
        local_57e0 = local_3328;
        pAVar25 = (AV1_PRIMARY *)0x7fffffffffffffff;
        pMVar18 = (MACROBLOCK *)((local_48->enc_quant_dequant_params).quants.y_quant_fp[0x1b] + 4);
        in_stack_ffffffffffffa750 = (AV1_COMMON *)&stack0xffffffffffffa818;
        cm_00 = (AV1_COMMON *)local_57c0;
        cpi_00 = (AV1_COMP *)local_4890;
        cpi_01 = (AV1_COMP *)local_55d0;
        in_stack_ffffffffffffa748 = (motion_mode_best_st_candidate *)&stack0xffffffffffffb6a0;
        pRVar17 = (RD_STATS *)&stack0xffffffffffffa970;
        in_stack_ffffffffffffa760 = (MACROBLOCK *)&stack0xffffffffffffa810;
        in_stack_ffffffffffffa738 =
             (AV1_COMP *)CONCAT44((int)((ulong)in_stack_ffffffffffffa738 >> 0x20),iVar9.as_int);
        mbmi_00 = pMVar10;
        in_stack_ffffffffffffa740 = pAVar2;
        in_stack_ffffffffffffa770 = cm_00;
        in_stack_ffffffffffffa778 = cpi_00;
        in_stack_ffffffffffffa780 = in_stack_ffffffffffffa8b8;
        in_stack_ffffffffffffa788 = in_stack_ffffffffffffa760;
        CVar14 = in_stack_ffffffffffffa8b8;
        in_stack_ffffffffffffa808 =
             (RD_STATS *)
             handle_inter_mode(in_stack_ffffffffffffb3e8,in_stack_ffffffffffffb3e0,
                               in_stack_ffffffffffffb3d8,in_stack_ffffffffffffb3d7,
                               in_stack_ffffffffffffb3c8,in_stack_ffffffffffffb3c0,
                               in_stack_ffffffffffffb430,in_stack_ffffffffffffb438,
                               (int64_t)in_stack_ffffffffffffb440,in_stack_ffffffffffffb448,
                               in_stack_ffffffffffffb450,in_stack_ffffffffffffb458,
                               in_stack_ffffffffffffb460,in_stack_ffffffffffffb468,
                               in_stack_ffffffffffffb470,in_stack_ffffffffffffb478,
                               in_stack_ffffffffffffb480,in_stack_ffffffffffffb488);
        CVar15 = in_stack_ffffffffffffa8b8;
        if ((pAVar26->current_frame).reference_mode != '\0') {
          if ((((local_4810[4] & 1) == 0) &&
              (0 < (local_80->inter_sf).prune_comp_search_by_single_result)) &&
             (iVar7 = is_inter_singleref_mode(mode), iVar7 != 0)) {
            collect_single_states
                      ((MACROBLOCK *)CONCAT44(in_stack_ffffffffffffa794,in_stack_ffffffffffffa790),
                       (InterModeSearchState *)in_stack_ffffffffffffa788,
                       (MB_MODE_INFO *)in_stack_ffffffffffffa780);
          }
          CVar15 = in_stack_ffffffffffffa8b8;
          if ((0 < (local_80->inter_sf).prune_comp_using_best_single_mode_ref) &&
             (iVar7 = is_inter_singleref_mode(mode), CVar15 = in_stack_ffffffffffffa8b8, iVar7 != 0)
             ) {
            update_best_single_mode
                      ((InterModeSearchState *)local_3338,mode,ref_frame_00,
                       (int64_t)in_stack_ffffffffffffa808);
            CVar15 = in_stack_ffffffffffffa8b8;
          }
        }
        in_stack_ffffffffffffa8b8 = CVar14;
        if (in_stack_ffffffffffffa808 != (RD_STATS *)0x7fffffffffffffff) {
          if (local_90[0x90] != BLOCK_4X4) {
            in_stack_ffffffffffffa868 = 0;
            local_57c0._0_4_ = 0;
          }
          if ((((local_80->inter_sf).prune_compound_using_single_ref != 0) &&
              (in_stack_ffffffffffffa8c8 != 0)) &&
             ((long)in_stack_ffffffffffffa808 <
              *(long *)(&stack0xffffffffffffa9c8 + (long)ref_frame_00 * 8))) {
            *(RD_STATS **)(&stack0xffffffffffffa9c8 + (long)ref_frame_00 * 8) =
                 in_stack_ffffffffffffa808;
          }
          adjust_cost(cpi_01,pMVar18,(int64_t *)mbmi_00);
          adjust_rdcost(cpi_01,pMVar18,(RD_STATS *)mbmi_00);
          if ((long)in_stack_ffffffffffffa808 < (long)local_3338._0_8_) {
            local_2ca8 = *(int_mv *)
                          ((long)((local_48->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0x10)
                          + (long)ref_frame_00 * 4);
            cm_00 = (AV1_COMMON *)
                    CONCAT44((int)((ulong)cm_00 >> 0x20),(uint)in_stack_ffffffffffffa8ee);
            CVar15.this_mv.as_int = iVar9.as_int;
            cpi_00 = local_48;
            update_search_state((InterModeSearchState *)in_stack_ffffffffffffa760,pRVar17,
                                (PICK_MODE_CONTEXT *)in_stack_ffffffffffffa750,
                                (RD_STATS *)in_stack_ffffffffffffa748,
                                (RD_STATS *)in_stack_ffffffffffffa740,
                                (RD_STATS *)in_stack_ffffffffffffa738,
                                (THR_MODES)in_stack_ffffffffffffa770,
                                (MACROBLOCK *)in_stack_ffffffffffffa778,
                                in_stack_ffffffffffffa780.this_mv.as_int);
            if (iVar9.as_int != 0) {
              local_3338._8_4_ = local_57e8;
              local_3338._12_4_ = iStack_57e4;
            }
            local_3328 = local_57e0;
            best_est_rd_00 = pAVar25;
          }
          if ((local_80->winner_mode_sf).motion_mode_for_winner_cand != 0) {
            handle_winner_cand((MB_MODE_INFO *)in_stack_ffffffffffffa750,in_stack_ffffffffffffa748,
                               (int)((ulong)in_stack_ffffffffffffa740 >> 0x20),
                               (int64_t)in_stack_ffffffffffffa738,(motion_mode_candidate *)cpi_01,
                               (int)((ulong)pMVar18 >> 0x20));
          }
          record_best_compound
                    ((local_68->current_frame).reference_mode,(RD_STATS *)&stack0xffffffffffffa890,
                     uVar8,*(int *)((local_48->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4
                                   ),(InterModeSearchState *)local_3338,local_57c8);
        }
      }
    }
    local_5701 = local_5701 + 1;
  }
  if ((local_80->winner_mode_sf).motion_mode_for_winner_cand != 0) {
    cpi_01 = (AV1_COMP *)local_3338;
    in_stack_ffffffffffffa738 = (AV1_COMP *)&stack0xffffffffffffa900;
    mbmi_00 = (MB_MODE_INFO *)((ulong)mbmi_00 & 0xffffffff00000000);
    evaluate_motion_mode_for_winner_candidates
              (in_stack_ffffffffffffa8a0,in_stack_ffffffffffffa898,in_stack_ffffffffffffa890,
               (HandleInterModeArgs *)in_stack_ffffffffffffa888,
               (TileDataEnc *)in_stack_ffffffffffffa880,in_stack_ffffffffffffa878,
               (buf_2d (*) [3])in_stack_ffffffffffffa8e0,
               (motion_mode_best_st_candidate *)
               CONCAT17(local_5701,CONCAT16(in_stack_ffffffffffffa8ee,in_stack_ffffffffffffa8e8)),
               (uint32_t)pAVar26,in_stack_ffffffffffffa8f8,(int64_t *)best_est_rd_00,search_state_00
               ,yrd);
  }
  intra_mode_end = (THR_MODES)in_stack_ffffffffffffa770;
  uVar24 = (undefined4)((ulong)cpi_01 >> 0x20);
  skippable = (int)((ulong)mbmi_00 >> 0x20);
  uVar16 = (uint32_t)((ulong)best_est_rd_00 >> 0x20);
  if (iVar9.as_int != 1) {
    uVar24 = (undefined4)((ulong)&stack0xffffffffffffa900 >> 0x20);
    pRVar17 = local_50;
    tx_search_best_inter_candidates
              (in_stack_ffffffffffffa988,in_stack_ffffffffffffa980,in_stack_ffffffffffffa978,
               (int64_t)in_stack_ffffffffffffa970,in_stack_ffffffffffffa96f,
               in_stack_ffffffffffffa960,iVar5,iVar7,(InterModeSearchState *)search_state_01,
               (RD_STATS *)in_stack_ffffffffffffa9c8,(PICK_MODE_CONTEXT *)in_stack_ffffffffffffa9d0,
               (int64_t *)in_stack_ffffffffffffa9d8);
    skippable = (int)((ulong)pRVar17 >> 0x20);
  }
  skip_intra_modes_in_interframe
            (cm_01,(macroblock *)
                   CONCAT44(uVar6,CONCAT13(uVar23,CONCAT12(in_stack_ffffffffffffa7aa,
                                                           CONCAT11(in_stack_ffffffffffffa7a9,
                                                                    in_stack_ffffffffffffa7a8)))),
             BVar22,(InterModeSearchState *)
                    CONCAT44(in_stack_ffffffffffffa79c,in_stack_ffffffffffffa798),
             (SPEED_FEATURES *)CONCAT44(in_stack_ffffffffffffa794,in_stack_ffffffffffffa790),
             (int64_t)in_stack_ffffffffffffa788,(int64_t)in_stack_ffffffffffffa7c0);
  search_intra_modes_in_interframe
            (in_stack_ffffffffffffb1a0,in_stack_ffffffffffffb198,in_stack_ffffffffffffb190,
             in_stack_ffffffffffffb188,in_stack_ffffffffffffb187,in_stack_ffffffffffffb178,
             in_stack_ffffffffffffb1d0,in_stack_ffffffffffffb1d8,(int64_t)in_stack_ffffffffffffb1e0)
  ;
  if ((local_80->winner_mode_sf).multi_winner_mode_type == '\0') {
    iVar5 = 1;
  }
  else {
    iVar5 = (local_48->td).mb.mode_costs.palette_y_color_cost[1][0][4];
  }
  CVar14 = (CANDIDATE_MV)((long)local_55d0 + 8);
  ctx_00 = &local_3264;
  xd_00 = (MACROBLOCKD *)CONCAT44(uVar16,local_3270.as_int);
  pMVar18 = (MACROBLOCK *)CONCAT44(uVar24,iVar5);
  refine_winner_mode_tx
            (in_stack_ffffffffffffa888,in_stack_ffffffffffffa880,
             (RD_STATS *)in_stack_ffffffffffffa878,in_stack_ffffffffffffa877,
             (PICK_MODE_CONTEXT *)CONCAT44(in_stack_ffffffffffffa86c,in_stack_ffffffffffffa868),
             (THR_MODES *)in_stack_ffffffffffffa860,in_stack_ffffffffffffa8b0,
             (buf_2d (*) [3])in_stack_ffffffffffffa8b8,in_stack_ffffffffffffa8c0,
             in_stack_ffffffffffffa8c8,(int *)in_stack_ffffffffffffa8d0,in_stack_ffffffffffffa8d8);
  set_mode_eval_params
            (in_stack_ffffffffffffa740,(MACROBLOCK *)in_stack_ffffffffffffa738,
             (MODE_EVAL_TYPE)((ulong)pMVar18 >> 0x38));
  bVar20 = false;
  uVar24 = local_55d0._1032_4_;
  if (((local_38->oxcf).tool_cfg.enable_palette & 1U) != 0) {
    iVar7 = av1_allow_palette((uint)(local_70->allow_screen_content_tools & 1),*local_90);
    bVar20 = false;
    uVar24 = local_55d0._1032_4_;
    if (iVar7 != 0) {
      iVar7 = is_inter_mode(auStack_3320[2]);
      bVar20 = false;
      uVar24 = local_55d0._1032_4_;
      if (iVar7 == 0) {
        bVar20 = local_50->rate != 0x7fffffff;
      }
    }
  }
  uVar6 = (uint)bVar20;
  if ((uVar6 != 0) &&
     (CVar14 = (CANDIDATE_MV)local_3338._0_8_,
     iVar9.as_int = av1_search_palette_mode
                              (in_stack_ffffffffffffb0f8,in_stack_ffffffffffffb0f0,
                               in_stack_ffffffffffffb0e8,in_stack_ffffffffffffb0e7,
                               in_stack_ffffffffffffb0e0,in_stack_ffffffffffffb0d8,
                               in_stack_ffffffffffffb140,(int64_t)in_stack_ffffffffffffb148),
     (long)in_stack_ffffffffffffa7e0 < (long)local_3338._0_8_)) {
    local_3260[0].as_int._0_1_ = -100;
    local_90[8] = BLOCK_4X4;
    local_90[9] = BLOCK_4X4;
    local_90[10] = BLOCK_4X4;
    local_90[0xb] = BLOCK_4X4;
    local_50->rate = local_5830;
    local_50->dist = (int64_t)in_stack_ffffffffffffa7d8;
    local_50->rdcost = (int64_t)in_stack_ffffffffffffa7e0;
    local_3338._0_8_ = local_50->rdcost;
    memcpy(auStack_3320,local_90,0xb0);
    local_3264.as_int = 0;
    local_3268 = iVar9;
    memcpy(*(void **)(local_60 + 0x118),(byte *)((long)local_98 + 1),
           (long)*(int *)(local_60 + 0x1a0));
    memcpy(*(void **)(local_60 + 0x198),local_88->tx_type_map,(long)*(int *)(local_60 + 0x1a0));
  }
  local_3279 = local_3279 & 0xffbf;
  if ((((local_68->current_frame).skip_mode_info.skip_mode_flag != 0) &&
      (iVar7 = is_comp_ref_allowed(local_51), iVar7 != 0)) &&
     (iVar7 = segfeature_active(&local_68->seg,(byte)*(undefined2 *)(local_90 + 0xa7) & 7,'\x05'),
     iVar7 == 0)) {
    rd_pick_skip_mode(in_stack_ffffffffffffa808,(InterModeSearchState *)CONCAT44(uVar24,iVar5),
                      (AV1_COMP *)CONCAT44(uVar6,in_stack_ffffffffffffa7f8),
                      in_stack_ffffffffffffa7f0,in_stack_ffffffffffffa7ef,
                      (buf_2d (*) [3])in_stack_ffffffffffffa7e0);
  }
  if ((((local_3279 >> 4 & 3) != 0) && (auStack_3320[2] != '\x10')) &&
     ((auStack_3320[2] != '\x18' && (iVar5 = have_nearmv_in_inter_mode(auStack_3320[2]), iVar5 == 0)
      ))) {
    local_3279 = local_3279 & 0xffcf;
  }
  if (((undefined1)local_3260[0].as_int == -1) ||
     ((long)in_stack_00000008 <= (long)local_3338._0_8_)) {
    local_50->rate = 0x7fffffff;
    local_50->rdcost = 0x7fffffffffffffff;
  }
  else {
    IVar4 = local_70->interp_filter;
    if (((local_38->rc).is_src_frame_alt_ref == 0) && ((local_80->inter_sf).adaptive_rd_thresh != 0)
       ) {
      CVar14.this_mv.as_int = 0x9c;
      xd_00 = (MACROBLOCKD *)CONCAT44((int)((ulong)xd_00 >> 0x20),0xa9);
      av1_update_rd_thresh_fact
                (in_stack_ffffffffffffa750,(int (*) [169])in_stack_ffffffffffffa748,
                 (int)((ulong)in_stack_ffffffffffffa740 >> 0x20),
                 (BLOCK_SIZE)((ulong)in_stack_ffffffffffffa740 >> 0x18),
                 (THR_MODES)((ulong)in_stack_ffffffffffffa740 >> 0x10),
                 (THR_MODES)((ulong)in_stack_ffffffffffffa740 >> 8),inter_mode_end,
                 in_stack_ffffffffffffa768,intra_mode_end);
    }
    memcpy(local_90,auStack_3320,0xb0);
    *(byte *)local_98 = (byte)*local_98 | (byte)local_3264.as_int;
    if (((local_90[2] == BLOCK_128X128) || (local_90[2] == (BLOCK_SIZES_ALL|BLOCK_4X8))) &&
       (iVar5 = is_nontrans_global_motion(xd_00,(MB_MODE_INFO *)CVar14), iVar5 != 0)) {
      IVar4 = av1_unswitchable_filter(IVar4);
      av1_broadcast_interp_filter(IVar4);
    }
    *(byte *)local_98 = (byte)*local_98 | (byte)local_3268.as_int;
    store_coding_context(pMVar18,(PICK_MODE_CONTEXT *)&ctx_00->as_mv,skippable);
    if (local_90[0x8f] != BLOCK_4X4) {
      av1_restore_uv_color_map
                ((AV1_COMP *)
                 CONCAT17(BVar22,CONCAT43(iVar21,CONCAT12(in_stack_ffffffffffffa7a2,
                                                          CONCAT11(in_stack_ffffffffffffa7a1,
                                                                   in_stack_ffffffffffffa7a0)))),
                 (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffa79c,in_stack_ffffffffffffa798));
    }
  }
  return;
}

Assistant:

void av1_rd_pick_inter_mode(struct AV1_COMP *cpi, struct TileDataEnc *tile_data,
                            struct macroblock *x, struct RD_STATS *rd_cost,
                            BLOCK_SIZE bsize, PICK_MODE_CONTEXT *ctx,
                            int64_t best_rd_so_far) {
  AV1_COMMON *const cm = &cpi->common;
  const FeatureFlags *const features = &cm->features;
  const int num_planes = av1_num_planes(cm);
  const SPEED_FEATURES *const sf = &cpi->sf;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  int i;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int *comp_inter_cost =
      mode_costs->comp_inter_cost[av1_get_reference_mode_context(xd)];

  InterModeSearchState search_state;
  init_inter_mode_search_state(&search_state, cpi, x, bsize, best_rd_so_far);
  INTERINTRA_MODE interintra_modes[REF_FRAMES] = {
    INTERINTRA_MODES, INTERINTRA_MODES, INTERINTRA_MODES, INTERINTRA_MODES,
    INTERINTRA_MODES, INTERINTRA_MODES, INTERINTRA_MODES, INTERINTRA_MODES
  };
  HandleInterModeArgs args = { { NULL },
                               { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE },
                               { NULL },
                               { MAX_SB_SIZE >> 1, MAX_SB_SIZE >> 1,
                                 MAX_SB_SIZE >> 1 },
                               NULL,
                               NULL,
                               NULL,
                               search_state.modelled_rd,
                               INT_MAX,
                               INT_MAX,
                               search_state.simple_rd,
                               0,
                               false,
                               interintra_modes,
                               { { { 0 }, { { 0 } }, { 0 }, 0, 0, 0, 0 } },
                               { { 0, 0 } },
                               { 0 },
                               0,
                               0,
                               -1,
                               -1,
                               -1,
                               { 0 },
                               { 0 },
                               UINT_MAX };
  // Currently, is_low_temp_var is used in real time encoding.
  const int is_low_temp_var = get_block_temp_var(cpi, x, bsize);

  for (i = 0; i < MODE_CTX_REF_FRAMES; ++i) args.cmp_mode[i] = -1;
  // Indicates the appropriate number of simple translation winner modes for
  // exhaustive motion mode evaluation
  const int max_winner_motion_mode_cand =
      num_winner_motion_modes[sf->winner_mode_sf.motion_mode_for_winner_cand];
  assert(max_winner_motion_mode_cand <= MAX_WINNER_MOTION_MODES);
  motion_mode_candidate motion_mode_cand;
  motion_mode_best_st_candidate best_motion_mode_cands;
  // Initializing the number of motion mode candidates to zero.
  best_motion_mode_cands.num_motion_mode_cand = 0;
  for (i = 0; i < MAX_WINNER_MOTION_MODES; ++i)
    best_motion_mode_cands.motion_mode_cand[i].rd_cost = INT64_MAX;

  for (i = 0; i < REF_FRAMES; ++i) x->pred_sse[i] = INT_MAX;

  av1_invalid_rd_stats(rd_cost);

  for (i = 0; i < REF_FRAMES; ++i) {
    x->warp_sample_info[i].num = -1;
  }

  // Ref frames that are selected by square partition blocks.
  int picked_ref_frames_mask = 0;
  if (sf->inter_sf.prune_ref_frame_for_rect_partitions &&
      mbmi->partition != PARTITION_NONE) {
    // prune_ref_frame_for_rect_partitions = 1 implies prune only extended
    // partition blocks. prune_ref_frame_for_rect_partitions >=2
    // implies prune for vert, horiz and extended partition blocks.
    if ((mbmi->partition != PARTITION_VERT &&
         mbmi->partition != PARTITION_HORZ) ||
        sf->inter_sf.prune_ref_frame_for_rect_partitions >= 2) {
      picked_ref_frames_mask =
          fetch_picked_ref_frames_mask(x, bsize, cm->seq_params->mib_size);
    }
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, set_params_rd_pick_inter_mode_time);
#endif
  // Skip ref frames that never selected by square blocks.
  const int skip_ref_frame_mask =
      picked_ref_frames_mask ? ~picked_ref_frames_mask : 0;
  mode_skip_mask_t mode_skip_mask;
  unsigned int ref_costs_single[REF_FRAMES];
  unsigned int ref_costs_comp[REF_FRAMES][REF_FRAMES];
  struct buf_2d yv12_mb[REF_FRAMES][MAX_MB_PLANE];
  // init params, set frame modes, speed features
  set_params_rd_pick_inter_mode(cpi, x, &args, bsize, &mode_skip_mask,
                                skip_ref_frame_mask, ref_costs_single,
                                ref_costs_comp, yv12_mb);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, set_params_rd_pick_inter_mode_time);
#endif

  int64_t best_est_rd = INT64_MAX;
  const InterModeRdModel *md = &tile_data->inter_mode_rd_models[bsize];
  // If do_tx_search is 0, only estimated RD should be computed.
  // If do_tx_search is 1, all modes have TX search performed.
  const int do_tx_search =
      !((sf->inter_sf.inter_mode_rd_model_estimation == 1 && md->ready) ||
        (sf->inter_sf.inter_mode_rd_model_estimation == 2 &&
         num_pels_log2_lookup[bsize] > 8));
  InterModesInfo *inter_modes_info = x->inter_modes_info;
  inter_modes_info->num = 0;

  // Temporary buffers used by handle_inter_mode().
  uint8_t *const tmp_buf = get_buf_by_bd(xd, x->tmp_pred_bufs[0]);

  // The best RD found for the reference frame, among single reference modes.
  // Note that the 0-th element will contain a cut-off that is later used
  // to determine if we should skip a compound mode.
  int64_t ref_frame_rd[REF_FRAMES] = { INT64_MAX, INT64_MAX, INT64_MAX,
                                       INT64_MAX, INT64_MAX, INT64_MAX,
                                       INT64_MAX, INT64_MAX };

  // Prepared stats used later to check if we could skip intra mode eval.
  int64_t inter_cost = -1;
  int64_t intra_cost = -1;
  // Need to tweak the threshold for hdres speed 0 & 1.
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // Obtain the relevant tpl stats for pruning inter modes
  PruneInfoFromTpl inter_cost_info_from_tpl;
#if !CONFIG_REALTIME_ONLY
  if (sf->inter_sf.prune_inter_modes_based_on_tpl) {
    // x->tpl_keep_ref_frame[id] = 1 => no pruning in
    // prune_ref_by_selective_ref_frame()
    // x->tpl_keep_ref_frame[id] = 0  => ref frame can be pruned in
    // prune_ref_by_selective_ref_frame()
    // Populating valid_refs[idx] = 1 ensures that
    // 'inter_cost_info_from_tpl.best_inter_cost' does not correspond to a
    // pruned ref frame.
    int valid_refs[INTER_REFS_PER_FRAME];
    for (MV_REFERENCE_FRAME frame = LAST_FRAME; frame < REF_FRAMES; frame++) {
      const MV_REFERENCE_FRAME refs[2] = { frame, NONE_FRAME };
      valid_refs[frame - 1] =
          x->tpl_keep_ref_frame[frame] ||
          !prune_ref_by_selective_ref_frame(
              cpi, x, refs, cm->cur_frame->ref_display_order_hint);
    }
    av1_zero(inter_cost_info_from_tpl);
    get_block_level_tpl_stats(cpi, bsize, mi_row, mi_col, valid_refs,
                              &inter_cost_info_from_tpl);
  }

  const int do_pruning =
      (AOMMIN(cm->width, cm->height) > 480 && cpi->speed <= 1) ? 0 : 1;
  if (do_pruning && sf->intra_sf.skip_intra_in_interframe &&
      cpi->oxcf.algo_cfg.enable_tpl_model)
    calculate_cost_from_tpl_data(cpi, x, bsize, mi_row, mi_col, &inter_cost,
                                 &intra_cost);
#endif  // !CONFIG_REALTIME_ONLY

  // Initialize best mode stats for winner mode processing.
  const int max_winner_mode_count =
      winner_mode_count_allowed[sf->winner_mode_sf.multi_winner_mode_type];
  zero_winner_mode_stats(bsize, max_winner_mode_count, x->winner_mode_stats);
  x->winner_mode_count = 0;
  store_winner_mode_stats(&cpi->common, x, mbmi, NULL, NULL, NULL, THR_INVALID,
                          NULL, bsize, best_rd_so_far,
                          sf->winner_mode_sf.multi_winner_mode_type, 0);

  int mode_thresh_mul_fact = (1 << MODE_THRESH_QBITS);
  if (sf->inter_sf.prune_inter_modes_if_skippable) {
    // Higher multiplication factor values for lower quantizers.
    mode_thresh_mul_fact = mode_threshold_mul_factor[x->qindex];
  }

  // Initialize arguments for mode loop speed features
  InterModeSFArgs sf_args = { &args.skip_motion_mode,
                              &mode_skip_mask,
                              &search_state,
                              skip_ref_frame_mask,
                              0,
                              mode_thresh_mul_fact,
                              0,
                              0 };
  int64_t best_inter_yrd = INT64_MAX;

  // This is the main loop of this function. It loops over all possible inter
  // modes and calls handle_inter_mode() to compute the RD for each.
  // Here midx is just an iterator index that should not be used by itself
  // except to keep track of the number of modes searched. It should be used
  // with av1_default_mode_order to get the enum that defines the mode, which
  // can be used with av1_mode_defs to get the prediction mode and the ref
  // frames.
  // TODO(yunqing, any): Setting mode_start and mode_end outside for-loop brings
  // good speedup for real time case. If we decide to use compound mode in real
  // time, maybe we can modify av1_default_mode_order table.
  THR_MODES mode_start = THR_INTER_MODE_START;
  THR_MODES mode_end = THR_INTER_MODE_END;
  const CurrentFrame *const current_frame = &cm->current_frame;
  if (current_frame->reference_mode == SINGLE_REFERENCE) {
    mode_start = SINGLE_REF_MODE_START;
    mode_end = SINGLE_REF_MODE_END;
  }

  for (THR_MODES midx = mode_start; midx < mode_end; ++midx) {
    // Get the actual prediction mode we are trying in this iteration
    const THR_MODES mode_enum = av1_default_mode_order[midx];
    const MODE_DEFINITION *mode_def = &av1_mode_defs[mode_enum];
    const PREDICTION_MODE this_mode = mode_def->mode;
    const MV_REFERENCE_FRAME *ref_frames = mode_def->ref_frame;

    const MV_REFERENCE_FRAME ref_frame = ref_frames[0];
    const MV_REFERENCE_FRAME second_ref_frame = ref_frames[1];
    const int is_single_pred =
        ref_frame > INTRA_FRAME && second_ref_frame == NONE_FRAME;
    const int comp_pred = second_ref_frame > INTRA_FRAME;

    init_mbmi(mbmi, this_mode, ref_frames, cm);

    txfm_info->skip_txfm = 0;
    sf_args.num_single_modes_processed += is_single_pred;
    set_ref_ptrs(cm, xd, ref_frame, second_ref_frame);
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, skip_inter_mode_time);
#endif
    // Apply speed features to decide if this inter mode can be skipped
    const int is_skip_inter_mode = skip_inter_mode(
        cpi, x, bsize, ref_frame_rd, midx, &sf_args, is_low_temp_var);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, skip_inter_mode_time);
#endif
    if (is_skip_inter_mode) continue;

    // Select prediction reference frames.
    for (i = 0; i < num_planes; i++) {
      xd->plane[i].pre[0] = yv12_mb[ref_frame][i];
      if (comp_pred) xd->plane[i].pre[1] = yv12_mb[second_ref_frame][i];
    }

    mbmi->angle_delta[PLANE_TYPE_Y] = 0;
    mbmi->angle_delta[PLANE_TYPE_UV] = 0;
    mbmi->filter_intra_mode_info.use_filter_intra = 0;
    mbmi->ref_mv_idx = 0;

    const int64_t ref_best_rd = search_state.best_rd;
    RD_STATS rd_stats, rd_stats_y, rd_stats_uv;
    av1_init_rd_stats(&rd_stats);

    const int ref_frame_cost = comp_pred
                                   ? ref_costs_comp[ref_frame][second_ref_frame]
                                   : ref_costs_single[ref_frame];
    const int compmode_cost =
        is_comp_ref_allowed(mbmi->bsize) ? comp_inter_cost[comp_pred] : 0;
    const int real_compmode_cost =
        cm->current_frame.reference_mode == REFERENCE_MODE_SELECT
            ? compmode_cost
            : 0;
    // Point to variables that are maintained between loop iterations
    args.single_newmv = search_state.single_newmv;
    args.single_newmv_rate = search_state.single_newmv_rate;
    args.single_newmv_valid = search_state.single_newmv_valid;
    args.single_comp_cost = real_compmode_cost;
    args.ref_frame_cost = ref_frame_cost;
    args.best_pred_sse = search_state.best_pred_sse;
    args.skip_ifs = skip_interp_filter_search(cpi, is_single_pred);

    if (!frame_is_kf_gf_arf(cpi) && cpi->oxcf.algo_cfg.sharpness == 3) {
      if (ref_frame != ALTREF_FRAME && ref_frame != GOLDEN_FRAME &&
          ref_frame != INTRA_FRAME)
        continue;
    }

    int64_t skip_rd[2] = { search_state.best_skip_rd[0],
                           search_state.best_skip_rd[1] };
    int64_t this_yrd = INT64_MAX;
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, handle_inter_mode_time);
#endif
    int64_t this_rd = handle_inter_mode(
        cpi, tile_data, x, bsize, &rd_stats, &rd_stats_y, &rd_stats_uv, &args,
        ref_best_rd, tmp_buf, &x->comp_rd_buffer, &best_est_rd, do_tx_search,
        inter_modes_info, &motion_mode_cand, skip_rd, &inter_cost_info_from_tpl,
        &this_yrd);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, handle_inter_mode_time);
#endif
    if (current_frame->reference_mode != SINGLE_REFERENCE) {
      if (!args.skip_ifs &&
          sf->inter_sf.prune_comp_search_by_single_result > 0 &&
          is_inter_singleref_mode(this_mode)) {
        collect_single_states(x, &search_state, mbmi);
      }

      if (sf->inter_sf.prune_comp_using_best_single_mode_ref > 0 &&
          is_inter_singleref_mode(this_mode))
        update_best_single_mode(&search_state, this_mode, ref_frame, this_rd);
    }

    if (this_rd == INT64_MAX) continue;

    if (mbmi->skip_txfm) {
      rd_stats_y.rate = 0;
      rd_stats_uv.rate = 0;
    }

    if (sf->inter_sf.prune_compound_using_single_ref && is_single_pred &&
        this_rd < ref_frame_rd[ref_frame]) {
      ref_frame_rd[ref_frame] = this_rd;
    }

    adjust_cost(cpi, x, &this_rd);
    adjust_rdcost(cpi, x, &rd_stats);

    // Did this mode help, i.e., is it the new best mode
    if (this_rd < search_state.best_rd) {
      assert(IMPLIES(comp_pred,
                     cm->current_frame.reference_mode != SINGLE_REFERENCE));
      search_state.best_pred_sse = x->pred_sse[ref_frame];
      best_inter_yrd = this_yrd;
      update_search_state(&search_state, rd_cost, ctx, &rd_stats, &rd_stats_y,
                          &rd_stats_uv, mode_enum, x, do_tx_search);
      if (do_tx_search) search_state.best_skip_rd[0] = skip_rd[0];
      // skip_rd[0] is the best total rd for a skip mode so far.
      // skip_rd[1] is the best total rd for a skip mode so far in luma.
      // When do_tx_search = 1, both skip_rd[0] and skip_rd[1] are updated.
      // When do_tx_search = 0, skip_rd[1] is updated.
      search_state.best_skip_rd[1] = skip_rd[1];
    }
    if (sf->winner_mode_sf.motion_mode_for_winner_cand) {
      // Add this mode to motion mode candidate list for motion mode search
      // if using motion_mode_for_winner_cand speed feature
      handle_winner_cand(mbmi, &best_motion_mode_cands,
                         max_winner_motion_mode_cand, this_rd,
                         &motion_mode_cand, args.skip_motion_mode);
    }

    /* keep record of best compound/single-only prediction */
    record_best_compound(cm->current_frame.reference_mode, &rd_stats, comp_pred,
                         x->rdmult, &search_state, compmode_cost);
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, evaluate_motion_mode_for_winner_candidates_time);
#endif
  if (sf->winner_mode_sf.motion_mode_for_winner_cand) {
    // For the single ref winner candidates, evaluate other motion modes (non
    // simple translation).
    evaluate_motion_mode_for_winner_candidates(
        cpi, x, rd_cost, &args, tile_data, ctx, yv12_mb,
        &best_motion_mode_cands, do_tx_search, bsize, &best_est_rd,
        &search_state, &best_inter_yrd);
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, evaluate_motion_mode_for_winner_candidates_time);
#endif

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, do_tx_search_time);
#endif
  if (do_tx_search != 1) {
    // A full tx search has not yet been done, do tx search for
    // top mode candidates
    tx_search_best_inter_candidates(cpi, tile_data, x, best_rd_so_far, bsize,
                                    yv12_mb, mi_row, mi_col, &search_state,
                                    rd_cost, ctx, &best_inter_yrd);
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, do_tx_search_time);
#endif

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, handle_intra_mode_time);
#endif
  // Gate intra mode evaluation if best of inter is skip except when source
  // variance is extremely low and also based on max intra bsize.
  skip_intra_modes_in_interframe(cm, x, bsize, &search_state, sf, inter_cost,
                                 intra_cost);

  const unsigned int intra_ref_frame_cost = ref_costs_single[INTRA_FRAME];
  search_intra_modes_in_interframe(&search_state, cpi, x, rd_cost, bsize, ctx,
                                   &sf_args, intra_ref_frame_cost,
                                   best_inter_yrd);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, handle_intra_mode_time);
#endif

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, refine_winner_mode_tx_time);
#endif
  int winner_mode_count =
      sf->winner_mode_sf.multi_winner_mode_type ? x->winner_mode_count : 1;
  // In effect only when fast tx search speed features are enabled.
  refine_winner_mode_tx(
      cpi, x, rd_cost, bsize, ctx, &search_state.best_mode_index,
      &search_state.best_mbmode, yv12_mb, search_state.best_rate_y,
      search_state.best_rate_uv, &search_state.best_skip2, winner_mode_count);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, refine_winner_mode_tx_time);
#endif

  // Initialize default mode evaluation params
  set_mode_eval_params(cpi, x, DEFAULT_EVAL);

  // Only try palette mode when the best mode so far is an intra mode.
  const int try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(features->allow_screen_content_tools, mbmi->bsize) &&
      !is_inter_mode(search_state.best_mbmode.mode) && rd_cost->rate != INT_MAX;
  RD_STATS this_rd_cost;
  int this_skippable = 0;
  if (try_palette) {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, av1_search_palette_mode_time);
#endif
    this_skippable = av1_search_palette_mode(
        &search_state.intra_search_state, cpi, x, bsize, intra_ref_frame_cost,
        ctx, &this_rd_cost, search_state.best_rd);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, av1_search_palette_mode_time);
#endif
    if (this_rd_cost.rdcost < search_state.best_rd) {
      search_state.best_mode_index = THR_DC;
      mbmi->mv[0].as_int = 0;
      rd_cost->rate = this_rd_cost.rate;
      rd_cost->dist = this_rd_cost.dist;
      rd_cost->rdcost = this_rd_cost.rdcost;
      search_state.best_rd = rd_cost->rdcost;
      search_state.best_mbmode = *mbmi;
      search_state.best_skip2 = 0;
      search_state.best_mode_skippable = this_skippable;
      memcpy(ctx->blk_skip, txfm_info->blk_skip,
             sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
      av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    }
  }

  search_state.best_mbmode.skip_mode = 0;
  if (cm->current_frame.skip_mode_info.skip_mode_flag &&
      is_comp_ref_allowed(bsize)) {
    const struct segmentation *const seg = &cm->seg;
    unsigned char segment_id = mbmi->segment_id;
    if (!segfeature_active(seg, segment_id, SEG_LVL_REF_FRAME)) {
      rd_pick_skip_mode(rd_cost, &search_state, cpi, x, bsize, yv12_mb);
    }
  }

  // Make sure that the ref_mv_idx is only nonzero when we're
  // using a mode which can support ref_mv_idx
  if (search_state.best_mbmode.ref_mv_idx != 0 &&
      !(search_state.best_mbmode.mode == NEWMV ||
        search_state.best_mbmode.mode == NEW_NEWMV ||
        have_nearmv_in_inter_mode(search_state.best_mbmode.mode))) {
    search_state.best_mbmode.ref_mv_idx = 0;
  }

  if (search_state.best_mode_index == THR_INVALID ||
      search_state.best_rd >= best_rd_so_far) {
    rd_cost->rate = INT_MAX;
    rd_cost->rdcost = INT64_MAX;
    return;
  }

  const InterpFilter interp_filter = features->interp_filter;
  assert((interp_filter == SWITCHABLE) ||
         (interp_filter ==
          search_state.best_mbmode.interp_filters.as_filters.y_filter) ||
         !is_inter_block(&search_state.best_mbmode));
  assert((interp_filter == SWITCHABLE) ||
         (interp_filter ==
          search_state.best_mbmode.interp_filters.as_filters.x_filter) ||
         !is_inter_block(&search_state.best_mbmode));

  if (!cpi->rc.is_src_frame_alt_ref && sf->inter_sf.adaptive_rd_thresh) {
    av1_update_rd_thresh_fact(
        cm, x->thresh_freq_fact, sf->inter_sf.adaptive_rd_thresh, bsize,
        search_state.best_mode_index, mode_start, mode_end, THR_DC, MAX_MODES);
  }

  // macroblock modes
  *mbmi = search_state.best_mbmode;
  txfm_info->skip_txfm |= search_state.best_skip2;

  // Note: this section is needed since the mode may have been forced to
  // GLOBALMV by the all-zero mode handling of ref-mv.
  if (mbmi->mode == GLOBALMV || mbmi->mode == GLOBAL_GLOBALMV) {
    // Correct the interp filters for GLOBALMV
    if (is_nontrans_global_motion(xd, xd->mi[0])) {
      int_interpfilters filters =
          av1_broadcast_interp_filter(av1_unswitchable_filter(interp_filter));
      assert(mbmi->interp_filters.as_int == filters.as_int);
      (void)filters;
    }
  }

  txfm_info->skip_txfm |= search_state.best_mode_skippable;

  assert(search_state.best_mode_index != THR_INVALID);

#if CONFIG_INTERNAL_STATS
  store_coding_context(x, ctx, search_state.best_mode_index,
                       search_state.best_mode_skippable);
#else
  store_coding_context(x, ctx, search_state.best_mode_skippable);
#endif  // CONFIG_INTERNAL_STATS

  if (mbmi->palette_mode_info.palette_size[1] > 0) {
    assert(try_palette);
    av1_restore_uv_color_map(cpi, x);
  }
}